

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_tester.cc
# Opt level: O0

void __thiscall
google::protobuf::MapReflectionTester::ExpectClearViaReflectionIterator
          (MapReflectionTester *this,Message *message)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  bool bVar2;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  this_00;
  FieldDescriptor *pFVar3;
  char *pcVar4;
  char *in_R9;
  string local_10a8;
  AssertHelper local_1088;
  Message local_1080;
  string_view local_1078;
  MapIterator local_1068;
  string_view local_1020;
  MapIterator local_1010;
  bool local_fc1;
  undefined1 local_fc0 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_f90;
  Message local_f88;
  string_view local_f80;
  MapIterator local_f70;
  string_view local_f28;
  MapIterator local_f18;
  bool local_ec9;
  undefined1 local_ec8 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_e98;
  Message local_e90;
  string_view local_e88;
  MapIterator local_e78;
  string_view local_e30;
  MapIterator local_e20;
  bool local_dd1;
  undefined1 local_dd0 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_da0;
  Message local_d98;
  string_view local_d90;
  MapIterator local_d80;
  string_view local_d38;
  MapIterator local_d28;
  bool local_cd9;
  undefined1 local_cd8 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_ca8;
  Message local_ca0;
  string_view local_c98;
  MapIterator local_c88;
  string_view local_c40;
  MapIterator local_c30;
  bool local_be1;
  undefined1 local_be0 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_bb0;
  Message local_ba8;
  string_view local_ba0;
  MapIterator local_b90;
  string_view local_b48;
  MapIterator local_b38;
  bool local_ae9;
  undefined1 local_ae8 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_ab8;
  Message local_ab0;
  string_view local_aa8;
  MapIterator local_a98;
  string_view local_a50;
  MapIterator local_a40;
  bool local_9f1;
  undefined1 local_9f0 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_9c0;
  Message local_9b8;
  string_view local_9b0;
  MapIterator local_9a0;
  string_view local_958;
  MapIterator local_948;
  bool local_8f9;
  undefined1 local_8f8 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_8c8;
  Message local_8c0;
  string_view local_8b8;
  MapIterator local_8a8;
  string_view local_860;
  MapIterator local_850;
  bool local_801;
  undefined1 local_800 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_7d0;
  Message local_7c8;
  string_view local_7c0;
  MapIterator local_7b0;
  string_view local_768;
  MapIterator local_758;
  bool local_709;
  undefined1 local_708 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_6d8;
  Message local_6d0;
  string_view local_6c8;
  MapIterator local_6b8;
  string_view local_670;
  MapIterator local_660;
  bool local_611;
  undefined1 local_610 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_5e0;
  Message local_5d8;
  string_view local_5d0;
  MapIterator local_5c0;
  string_view local_578;
  MapIterator local_568;
  bool local_519;
  undefined1 local_518 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_4e8;
  Message local_4e0;
  string_view local_4d8;
  MapIterator local_4c8;
  string_view local_480;
  MapIterator local_470;
  bool local_421;
  undefined1 local_420 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_3f0;
  Message local_3e8;
  string_view local_3e0;
  MapIterator local_3d0;
  string_view local_388;
  MapIterator local_378;
  bool local_329;
  undefined1 local_328 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_2f8;
  Message local_2f0;
  string_view local_2e8;
  MapIterator local_2d8;
  string_view local_290;
  MapIterator local_280;
  bool local_231;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_200;
  Message local_1f8;
  string_view local_1f0;
  MapIterator local_1e0;
  string_view local_198;
  MapIterator local_188;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_108;
  Message local_100 [3];
  string_view local_e8;
  MapIterator local_d8;
  string_view local_90;
  MapIterator local_80;
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  Reflection *reflection;
  Message *message_local;
  MapReflectionTester *this_local;
  
  this_00.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )Message::GetReflection(message);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this_00.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_90,"map_int32_int32");
  pFVar3 = F(this,local_90);
  Reflection::MapBegin
            (&local_80,
             (Reflection *)
             this_00.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,message,pFVar3);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e8,"map_int32_int32");
  pFVar3 = F(this,local_e8);
  Reflection::MapEnd(&local_d8,
                     (Reflection *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,message,pFVar3);
  local_31 = protobuf::operator==(&local_80,&local_d8);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar2) {
    testing::Message::Message(local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_30,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_int32_int32\")) == reflection->MapEnd(message, F(\"map_int32_int32\"))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x662,pcVar4);
    testing::internal::AssertHelper::operator=(&local_108,local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_198,"map_int64_int64");
  pFVar3 = F(this,local_198);
  Reflection::MapBegin
            (&local_188,
             (Reflection *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,message,pFVar3);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1f0,"map_int64_int64");
  pFVar3 = F(this,local_1f0);
  Reflection::MapEnd(&local_1e0,
                     (Reflection *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,message,pFVar3);
  local_139 = protobuf::operator==(&local_188,&local_1e0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_138,&local_139,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar2) {
    testing::Message::Message(&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_138,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_int64_int64\")) == reflection->MapEnd(message, F(\"map_int64_int64\"))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x664,pcVar4);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_290,"map_uint32_uint32");
  pFVar3 = F(this,local_290);
  Reflection::MapBegin
            (&local_280,
             (Reflection *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,message,pFVar3);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2e8,"map_uint32_uint32");
  pFVar3 = F(this,local_2e8);
  Reflection::MapEnd(&local_2d8,
                     (Reflection *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,message,pFVar3);
  local_231 = protobuf::operator==(&local_280,&local_2d8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_230,&local_231,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar2) {
    testing::Message::Message(&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_230,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_uint32_uint32\")) == reflection->MapEnd(message, F(\"map_uint32_uint32\"))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x666,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_388,"map_uint64_uint64");
  pFVar3 = F(this,local_388);
  Reflection::MapBegin
            (&local_378,
             (Reflection *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,message,pFVar3);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3e0,"map_uint64_uint64");
  pFVar3 = F(this,local_3e0);
  Reflection::MapEnd(&local_3d0,
                     (Reflection *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,message,pFVar3);
  local_329 = protobuf::operator==(&local_378,&local_3d0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_328,&local_329,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar2) {
    testing::Message::Message(&local_3e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_328,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_uint64_uint64\")) == reflection->MapEnd(message, F(\"map_uint64_uint64\"))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x668,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_480,"map_sint32_sint32");
  pFVar3 = F(this,local_480);
  Reflection::MapBegin
            (&local_470,
             (Reflection *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,message,pFVar3);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_4d8,"map_sint32_sint32");
  pFVar3 = F(this,local_4d8);
  Reflection::MapEnd(&local_4c8,
                     (Reflection *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,message,pFVar3);
  local_421 = protobuf::operator==(&local_470,&local_4c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_420,&local_421,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar2) {
    testing::Message::Message(&local_4e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_420,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_sint32_sint32\")) == reflection->MapEnd(message, F(\"map_sint32_sint32\"))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x66a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper(&local_4e8);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_578,"map_sint64_sint64");
  pFVar3 = F(this,local_578);
  Reflection::MapBegin
            (&local_568,
             (Reflection *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,message,pFVar3);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_5d0,"map_sint64_sint64");
  pFVar3 = F(this,local_5d0);
  Reflection::MapEnd(&local_5c0,
                     (Reflection *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,message,pFVar3);
  local_519 = protobuf::operator==(&local_568,&local_5c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_518,&local_519,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar2) {
    testing::Message::Message(&local_5d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_518,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_sint64_sint64\")) == reflection->MapEnd(message, F(\"map_sint64_sint64\"))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x66c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_5e0,&local_5d8);
    testing::internal::AssertHelper::~AssertHelper(&local_5e0);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_5d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_670,"map_fixed32_fixed32");
  pFVar3 = F(this,local_670);
  Reflection::MapBegin
            (&local_660,
             (Reflection *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,message,pFVar3);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_6c8,"map_fixed32_fixed32");
  pFVar3 = F(this,local_6c8);
  Reflection::MapEnd(&local_6b8,
                     (Reflection *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,message,pFVar3);
  local_611 = protobuf::operator==(&local_660,&local_6b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_610,&local_611,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_610);
  if (!bVar2) {
    testing::Message::Message(&local_6d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_610,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_fixed32_fixed32\")) == reflection->MapEnd(message, F(\"map_fixed32_fixed32\"))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x66e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_6d8,&local_6d0);
    testing::internal::AssertHelper::~AssertHelper(&local_6d8);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_6d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_610);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_768,"map_fixed64_fixed64");
  pFVar3 = F(this,local_768);
  Reflection::MapBegin
            (&local_758,
             (Reflection *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,message,pFVar3);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_7c0,"map_fixed64_fixed64");
  pFVar3 = F(this,local_7c0);
  Reflection::MapEnd(&local_7b0,
                     (Reflection *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,message,pFVar3);
  local_709 = protobuf::operator==(&local_758,&local_7b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_708,&local_709,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_708);
  if (!bVar2) {
    testing::Message::Message(&local_7c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_708,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_fixed64_fixed64\")) == reflection->MapEnd(message, F(\"map_fixed64_fixed64\"))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x670,pcVar4);
    testing::internal::AssertHelper::operator=(&local_7d0,&local_7c8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_7c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_708);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_860,"map_sfixed32_sfixed32");
  pFVar3 = F(this,local_860);
  Reflection::MapBegin
            (&local_850,
             (Reflection *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,message,pFVar3);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_8b8,"map_sfixed32_sfixed32");
  pFVar3 = F(this,local_8b8);
  Reflection::MapEnd(&local_8a8,
                     (Reflection *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,message,pFVar3);
  local_801 = protobuf::operator==(&local_850,&local_8a8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_800,&local_801,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_800);
  if (!bVar2) {
    testing::Message::Message(&local_8c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_800,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_sfixed32_sfixed32\")) == reflection->MapEnd(message, F(\"map_sfixed32_sfixed32\"))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x672,pcVar4);
    testing::internal::AssertHelper::operator=(&local_8c8,&local_8c0);
    testing::internal::AssertHelper::~AssertHelper(&local_8c8);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_8c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_800);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_958,"map_sfixed64_sfixed64");
  pFVar3 = F(this,local_958);
  Reflection::MapBegin
            (&local_948,
             (Reflection *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,message,pFVar3);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_9b0,"map_sfixed64_sfixed64");
  pFVar3 = F(this,local_9b0);
  Reflection::MapEnd(&local_9a0,
                     (Reflection *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,message,pFVar3);
  local_8f9 = protobuf::operator==(&local_948,&local_9a0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8f8,&local_8f9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f8);
  if (!bVar2) {
    testing::Message::Message(&local_9b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_8f8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_sfixed64_sfixed64\")) == reflection->MapEnd(message, F(\"map_sfixed64_sfixed64\"))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x674,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c0,&local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_9b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f8);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_a50,"map_int32_float");
  pFVar3 = F(this,local_a50);
  Reflection::MapBegin
            (&local_a40,
             (Reflection *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,message,pFVar3);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_aa8,"map_int32_float");
  pFVar3 = F(this,local_aa8);
  Reflection::MapEnd(&local_a98,
                     (Reflection *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,message,pFVar3);
  local_9f1 = protobuf::operator==(&local_a40,&local_a98);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9f0,&local_9f1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f0);
  if (!bVar2) {
    testing::Message::Message(&local_ab0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_9f0,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_int32_float\")) == reflection->MapEnd(message, F(\"map_int32_float\"))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ab8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x676,pcVar4);
    testing::internal::AssertHelper::operator=(&local_ab8,&local_ab0);
    testing::internal::AssertHelper::~AssertHelper(&local_ab8);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_ab0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9f0);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b48,"map_int32_double");
  pFVar3 = F(this,local_b48);
  Reflection::MapBegin
            (&local_b38,
             (Reflection *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,message,pFVar3);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_ba0,"map_int32_double");
  pFVar3 = F(this,local_ba0);
  Reflection::MapEnd(&local_b90,
                     (Reflection *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,message,pFVar3);
  local_ae9 = protobuf::operator==(&local_b38,&local_b90);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ae8,&local_ae9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae8);
  if (!bVar2) {
    testing::Message::Message(&local_ba8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_ae8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_int32_double\")) == reflection->MapEnd(message, F(\"map_int32_double\"))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x678,pcVar4);
    testing::internal::AssertHelper::operator=(&local_bb0,&local_ba8);
    testing::internal::AssertHelper::~AssertHelper(&local_bb0);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae8);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c40,"map_bool_bool");
  pFVar3 = F(this,local_c40);
  Reflection::MapBegin
            (&local_c30,
             (Reflection *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,message,pFVar3);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c98,"map_bool_bool");
  pFVar3 = F(this,local_c98);
  Reflection::MapEnd(&local_c88,
                     (Reflection *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,message,pFVar3);
  local_be1 = protobuf::operator==(&local_c30,&local_c88);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_be0,&local_be1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be0);
  if (!bVar2) {
    testing::Message::Message(&local_ca0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_be0,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_bool_bool\")) == reflection->MapEnd(message, F(\"map_bool_bool\"))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ca8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x67a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_ca8,&local_ca0);
    testing::internal::AssertHelper::~AssertHelper(&local_ca8);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_ca0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_be0);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d38,"map_string_string");
  pFVar3 = F(this,local_d38);
  Reflection::MapBegin
            (&local_d28,
             (Reflection *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,message,pFVar3);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d90,"map_string_string");
  pFVar3 = F(this,local_d90);
  Reflection::MapEnd(&local_d80,
                     (Reflection *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,message,pFVar3);
  local_cd9 = protobuf::operator==(&local_d28,&local_d80);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cd8,&local_cd9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd8);
  if (!bVar2) {
    testing::Message::Message(&local_d98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_cd8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_string_string\")) == reflection->MapEnd(message, F(\"map_string_string\"))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_da0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x67c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_da0,&local_d98);
    testing::internal::AssertHelper::~AssertHelper(&local_da0);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_d98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd8);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e30,"map_int32_bytes");
  pFVar3 = F(this,local_e30);
  Reflection::MapBegin
            (&local_e20,
             (Reflection *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,message,pFVar3);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e88,"map_int32_bytes");
  pFVar3 = F(this,local_e88);
  Reflection::MapEnd(&local_e78,
                     (Reflection *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,message,pFVar3);
  local_dd1 = protobuf::operator==(&local_e20,&local_e78);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_dd0,&local_dd1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd0);
  if (!bVar2) {
    testing::Message::Message(&local_e90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_dd0,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_int32_bytes\")) == reflection->MapEnd(message, F(\"map_int32_bytes\"))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x67e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e98,&local_e90);
    testing::internal::AssertHelper::~AssertHelper(&local_e98);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_e90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dd0);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_f28,"map_int32_enum");
  pFVar3 = F(this,local_f28);
  Reflection::MapBegin
            (&local_f18,
             (Reflection *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,message,pFVar3);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_f80,"map_int32_enum");
  pFVar3 = F(this,local_f80);
  Reflection::MapEnd(&local_f70,
                     (Reflection *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,message,pFVar3);
  local_ec9 = protobuf::operator==(&local_f18,&local_f70);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ec8,&local_ec9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ec8);
  if (!bVar2) {
    testing::Message::Message(&local_f88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_ec8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_int32_enum\")) == reflection->MapEnd(message, F(\"map_int32_enum\"))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x680,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f90,&local_f88);
    testing::internal::AssertHelper::~AssertHelper(&local_f90);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_f88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ec8);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1020,"map_int32_foreign_message");
  pFVar3 = F(this,local_1020);
  Reflection::MapBegin
            (&local_1010,
             (Reflection *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,message,pFVar3);
  uVar1 = gtest_ar_.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1078,"map_int32_foreign_message");
  pFVar3 = F(this,local_1078);
  Reflection::MapEnd(&local_1068,
                     (Reflection *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,message,pFVar3);
  local_fc1 = protobuf::operator==(&local_1010,&local_1068);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fc0,&local_fc1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fc0);
  if (!bVar2) {
    testing::Message::Message(&local_1080);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_10a8,(internal *)local_fc0,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_int32_foreign_message\")) == reflection->MapEnd(message, F(\"map_int32_foreign_message\"))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1088,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x682,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1088,&local_1080);
    testing::internal::AssertHelper::~AssertHelper(&local_1088);
    std::__cxx11::string::~string((string *)&local_10a8);
    testing::Message::~Message(&local_1080);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fc0);
  return;
}

Assistant:

void MapReflectionTester::ExpectClearViaReflectionIterator(Message* message) {
  const Reflection* reflection = message->GetReflection();
  EXPECT_TRUE(reflection->MapBegin(message, F("map_int32_int32")) ==
              reflection->MapEnd(message, F("map_int32_int32")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_int64_int64")) ==
              reflection->MapEnd(message, F("map_int64_int64")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_uint32_uint32")) ==
              reflection->MapEnd(message, F("map_uint32_uint32")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_uint64_uint64")) ==
              reflection->MapEnd(message, F("map_uint64_uint64")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_sint32_sint32")) ==
              reflection->MapEnd(message, F("map_sint32_sint32")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_sint64_sint64")) ==
              reflection->MapEnd(message, F("map_sint64_sint64")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_fixed32_fixed32")) ==
              reflection->MapEnd(message, F("map_fixed32_fixed32")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_fixed64_fixed64")) ==
              reflection->MapEnd(message, F("map_fixed64_fixed64")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_sfixed32_sfixed32")) ==
              reflection->MapEnd(message, F("map_sfixed32_sfixed32")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_sfixed64_sfixed64")) ==
              reflection->MapEnd(message, F("map_sfixed64_sfixed64")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_int32_float")) ==
              reflection->MapEnd(message, F("map_int32_float")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_int32_double")) ==
              reflection->MapEnd(message, F("map_int32_double")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_bool_bool")) ==
              reflection->MapEnd(message, F("map_bool_bool")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_string_string")) ==
              reflection->MapEnd(message, F("map_string_string")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_int32_bytes")) ==
              reflection->MapEnd(message, F("map_int32_bytes")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_int32_enum")) ==
              reflection->MapEnd(message, F("map_int32_enum")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_int32_foreign_message")) ==
              reflection->MapEnd(message, F("map_int32_foreign_message")));
}